

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

int __thiscall
OSSLRSA::decrypt(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  RSA *rsa_00;
  size_t sVar4;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  uchar *from;
  uchar *to;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 uVar5;
  int decSize;
  int osslPadding;
  RSA *rsa;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_3c;
  undefined1 local_1;
  
  iVar2 = (int)in;
  uVar3 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
  if ((uVar3 & 1) == 0) {
    softHSMLog(3,"decrypt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x50a,"Invalid key type supplied");
    local_1 = 0;
    uVar5 = extraout_RAX;
  }
  else {
    rsa_00 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                              ((OSSLRSAPrivateKey *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    sVar4 = ByteString::size((ByteString *)0x1c177f);
    iVar1 = RSA_size(rsa_00);
    if (sVar4 == (long)iVar1) {
      if (iVar2 == 1) {
        local_3c = 3;
      }
      else if (iVar2 == 3) {
        local_3c = 1;
      }
      else {
        if (iVar2 != 4) {
          softHSMLog(3,"decrypt",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x529,"Invalid padding mechanism supplied (%i)",(ulong)in & 0xffffffff);
          local_1 = 0;
          uVar5 = extraout_RAX_01;
          goto LAB_001c1906;
        }
        local_3c = 4;
      }
      RSA_size(rsa_00);
      ByteString::resize((ByteString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                         ,(size_t)outlen);
      sVar4 = ByteString::size((ByteString *)0x1c1876);
      iVar2 = (int)sVar4;
      from = ByteString::const_byte_str((ByteString *)outlen);
      to = ByteString::operator[]
                     ((ByteString *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),(size_t)outlen);
      iVar1 = RSA_private_decrypt(iVar2,from,to,rsa_00,local_3c);
      if (iVar1 == -1) {
        uVar3 = ERR_get_error();
        softHSMLog(3,"decrypt",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x534,"RSA private key decryption failed (0x%08X)",uVar3);
        local_1 = 0;
        uVar5 = extraout_RAX_02;
      }
      else {
        ByteString::resize((ByteString *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),(size_t)outlen);
        local_1 = 1;
        uVar5 = extraout_RAX_03;
      }
    }
    else {
      softHSMLog(3,"decrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x515,"Invalid amount of input data supplied for RSA decryption");
      local_1 = 0;
      uVar5 = extraout_RAX_00;
    }
  }
LAB_001c1906:
  return (int)CONCAT71((int7)((ulong)uVar5 >> 8),local_1);
}

Assistant:

bool OSSLRSA::decrypt(PrivateKey* privateKey, const ByteString& encryptedData,
		      ByteString& data, const AsymMech::Type padding)
{
	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	// Retrieve the OpenSSL key object
	RSA* rsa = ((OSSLRSAPrivateKey*) privateKey)->getOSSLKey();

	// Check the input size
	if (encryptedData.size() != (size_t) RSA_size(rsa))
	{
		ERROR_MSG("Invalid amount of input data supplied for RSA decryption");

		return false;
	}

	// Determine the OpenSSL padding algorithm
	int osslPadding = 0;

	switch (padding)
	{
		case AsymMech::RSA_PKCS:
			osslPadding = RSA_PKCS1_PADDING;
			break;
		case AsymMech::RSA_PKCS_OAEP:
			osslPadding = RSA_PKCS1_OAEP_PADDING;
			break;
		case AsymMech::RSA:
			osslPadding = RSA_NO_PADDING;
			break;
		default:
			ERROR_MSG("Invalid padding mechanism supplied (%i)", padding);
			return false;
	}

	// Perform the RSA operation
	data.resize(RSA_size(rsa));

	int decSize = RSA_private_decrypt(encryptedData.size(), (unsigned char*) encryptedData.const_byte_str(), &data[0], rsa, osslPadding);

	if (decSize == -1)
	{
		ERROR_MSG("RSA private key decryption failed (0x%08X)", ERR_get_error());

		return false;
	}

	data.resize(decSize);

	return true;
}